

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_flac_uninit(ma_flac *pFlac,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_dr_flac *in_RSI;
  ma_data_source *in_RDI;
  
  if (in_RDI != (ma_data_source *)0x0) {
    ma_dr_flac_close(in_RSI);
    ma_data_source_uninit(in_RDI);
  }
  return;
}

Assistant:

MA_API void ma_flac_uninit(ma_flac* pFlac, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pFlac == NULL) {
        return;
    }

    (void)pAllocationCallbacks;

    #if !defined(MA_NO_FLAC)
    {
        ma_dr_flac_close(pFlac->dr);
    }
    #else
    {
        /* flac is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);
    }
    #endif

    ma_data_source_uninit(&pFlac->ds);
}